

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackStartDocument(void *context)

{
  pointer pXVar1;
  XMLParser *state;
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  *in_stack_ffffffffffffff88;
  function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *__r;
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  *in_stack_ffffffffffffff90;
  XMLParserState *in_stack_ffffffffffffffa0;
  function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>
  *in_stack_ffffffffffffffa8;
  
  pXVar1 = std::
           unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         *)0x12784d);
  if ((pXVar1->m_logParsing & 1U) != 0) {
    iDynTree::reportInfo("XMLParser","parserCallbackStartDocument","Start document");
  }
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,std::deque<std::shared_ptr<iDynTree::XMLElement>,std::allocator<std::shared_ptr<iDynTree::XMLElement>>>>
  ::
  stack<std::deque<std::shared_ptr<iDynTree::XMLElement>,std::allocator<std::shared_ptr<iDynTree::XMLElement>>>,void>
            (in_stack_ffffffffffffff90);
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x127884);
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  ::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  ::~stack((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
            *)0x1278a2);
  pXVar1 = std::
           unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         *)0x1278ac);
  __r = &pXVar1->f_documentFactory;
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x1278c0);
  std::function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>::operator()
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x1278e2);
  std::shared_ptr<iDynTree::XMLDocument>::operator=
            ((shared_ptr<iDynTree::XMLDocument> *)in_stack_ffffffffffffff90,
             (shared_ptr<iDynTree::XMLDocument> *)__r);
  std::shared_ptr<iDynTree::XMLDocument>::~shared_ptr((shared_ptr<iDynTree::XMLDocument> *)0x127900)
  ;
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackStartDocument(void* context)
    {
        XMLParser *state = static_cast<XMLParser*>(context);
        if (state->m_pimpl->m_logParsing) {
            reportInfo("XMLParser", "parserCallbackStartDocument", "Start document");
        }
        // clear stack
        state->m_pimpl->m_parsedTrace = std::stack<std::shared_ptr<XMLElement>>();
        // create a Document type
        state->m_pimpl->m_document = std::shared_ptr<XMLDocument>(
            state->m_pimpl->f_documentFactory(state->m_pimpl->m_parserState));
    }